

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O1

void polymul_internal::composer<double,_2,_10,_10>::compose0(double *dst,double *p,double *c)

{
  composer<double,_2,_8,_10>::compose0(dst,p,c + 2);
  dst[0x35] = 0.0;
  dst[0x36] = 0.0;
  dst[0x33] = 0.0;
  dst[0x34] = 0.0;
  dst[0x31] = 0.0;
  dst[0x32] = 0.0;
  dst[0x2f] = 0.0;
  dst[0x30] = 0.0;
  dst[0x2d] = 0.0;
  dst[0x2e] = 0.0;
  taylor_inplace_multiplier<double,_2,_9,_9,_0>::mul(dst,p);
  *dst = c[1];
  dst[0x37] = 0.0;
  dst[0x38] = 0.0;
  dst[0x39] = 0.0;
  dst[0x3a] = 0.0;
  dst[0x3b] = 0.0;
  dst[0x3c] = 0.0;
  dst[0x3d] = 0.0;
  dst[0x3e] = 0.0;
  dst[0x3f] = 0.0;
  dst[0x40] = 0.0;
  dst[0x41] = 0.0;
  taylor_inplace_multiplier<double,_2,_10,_10,_0>::mul(dst,p);
  *dst = *c;
  return;
}

Assistant:

static void compose0(numtype dst[], const numtype p[], const numtype c[]) {
    composer<numtype, Nvar, Ndeg - 1, Ndegp>::compose0(dst, p, c + 1);
    // Zero top of dst
    for (int i = polylen<Nvar, Ndeg - 1>::len; i < polylen<Nvar, Ndeg>::len; i++)
      dst[i] = 0;
    // We now have R in dst, multiply by p and add c[0]
    taylor_inplace_multiplier < numtype, Nvar, Ndeg,
        Ndeg<Ndegp ? Ndeg : Ndegp, 0>::mul(dst, p);
    dst[0] = c[0];
  }